

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O3

int lws_parse_numeric_address(char *ads,uint8_t *result,size_t max_len)

{
  char cVar1;
  int iVar2;
  uint8_t *puVar3;
  size_t sVar4;
  lws_tokenize_elem lVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  uint8_t *puVar9;
  int iVar10;
  uint8_t *puVar11;
  int iVar12;
  uint uVar13;
  bool bVar14;
  char t [5];
  lws_tokenize ts;
  uint8_t temp [16];
  char local_99 [5];
  int local_94;
  ulong local_90;
  uint8_t *local_88;
  uint8_t *local_80;
  long local_78;
  lws_tokenize local_70;
  undefined1 local_48 [24];
  
  local_88 = result;
  pcVar6 = strchr(ads,0x3a);
  bVar14 = pcVar6 != (char *)0x0;
  lws_tokenize_init(&local_70,ads,0x41);
  local_70.len = strlen(ads);
  puVar11 = local_88;
  iVar10 = -1;
  if ((((6 < local_70.len || bVar14) && (iVar10 = -2, pcVar6 == (char *)0x0 || 1 < local_70.len)) &&
      (iVar10 = -3, 3 < max_len || pcVar6 != (char *)0x0)) &&
     (iVar10 = -4, 0xf < max_len || pcVar6 == (char *)0x0)) {
    if (pcVar6 != (char *)0x0) {
      memset(local_88,0,max_len);
    }
    local_80 = puVar11 + 0xc;
    local_78 = (long)(int)max_len;
    local_94 = -1;
    local_90 = 0;
    iVar10 = 0;
    puVar9 = puVar11;
    do {
      lVar5 = lws_tokenize(&local_70);
      sVar4 = local_70.token_len;
      puVar3 = local_88;
      iVar2 = local_94;
      local_70.e = (int8_t)lVar5;
      iVar12 = (int)puVar11;
      if (local_70.e == '\x01') {
        if (iVar10 == 0) {
          if (bVar14) {
            if (((puVar11[2] != 0xff) || (puVar11[3] != 0xff)) || (local_94 != 2)) {
              bVar14 = true;
              iVar10 = 1;
              if (*local_70.token != ':') {
                return -10;
              }
              goto LAB_001137b3;
            }
            local_90 = 0;
            memset(puVar11,0,max_len);
            puVar11[10] = 0xff;
            puVar11[0xb] = 0xff;
            local_94 = -1;
            puVar9 = local_80;
          }
          else if (*local_70.token != '.') {
            return -0xb;
          }
          iVar10 = 1;
          bVar14 = false;
        }
        else {
          if (1 < iVar10) {
            return -8;
          }
          if (*local_70.token != ':') {
            return -9;
          }
          iVar10 = iVar10 + 1;
          puVar9[0] = '\0';
          puVar9[1] = '\0';
          puVar9 = puVar9 + 2;
          local_94 = (int)puVar9 - iVar12;
        }
      }
      else {
        if (local_70.e != '\x02') {
          if (local_70.e != '\0') {
            _lws_log(1,"%s: malformed ip address\n","lws_parse_numeric_address");
            return -0xd;
          }
          if (((int)local_90 == 4 && !bVar14) || ((int)local_90 == 8 && bVar14)) {
            return (int)puVar9 - iVar12;
          }
          if (local_94 == -1) {
            return -0xc;
          }
          iVar12 = (int)puVar9 - iVar12;
          if (iVar12 == 0x10) {
            return 0x10;
          }
          puVar11 = local_88 + local_94;
          uVar13 = iVar12 - local_94;
          memcpy(local_48,puVar11,(ulong)uVar13);
          memset(puVar11,0,(ulong)(0x10 - iVar2));
          memcpy(puVar3 + (int)(0x10 - uVar13),local_48,(ulong)uVar13);
          return 0x10;
        }
        if (bVar14) {
          if (4 < local_70.token_len) {
            return -1;
          }
          memcpy(local_99,local_70.token,local_70.token_len);
          local_99[sVar4] = '\0';
          if (sVar4 != 0) {
            uVar7 = 0;
            do {
              cVar1 = local_99[uVar7];
              if ((byte)(cVar1 + 0x99U) < 0xc9) {
                return -1;
              }
              if ((byte)(cVar1 - 0x3aU) < 7) {
                return -1;
              }
              if ((byte)(cVar1 + 0xb9U) < 0x1a) {
                return -1;
              }
              uVar7 = uVar7 + 1;
            } while (sVar4 != uVar7);
          }
          lVar8 = strtol(local_99,(char **)0x0,0x10);
          if (0xffff < lVar8) {
            return -5;
          }
          *puVar9 = (uint8_t)((ulong)lVar8 >> 8);
          puVar9 = puVar9 + 1;
        }
        else {
          if (3 < local_70.token_len) {
            return -1;
          }
          memcpy(local_99,local_70.token,local_70.token_len);
          local_99[sVar4] = '\0';
          if (sVar4 != 0) {
            uVar7 = 0;
            do {
              if ((byte)(local_99[uVar7] - 0x3aU) < 0xf6) {
                return -1;
              }
              uVar7 = uVar7 + 1;
            } while (sVar4 != uVar7);
          }
          lVar8 = strtol(local_99,(char **)0x0,10);
          if (0xff < lVar8) {
            return -6;
          }
        }
        if (lVar8 < 0) {
          return -7;
        }
        *puVar9 = (uint8_t)lVar8;
        puVar9 = puVar9 + 1;
        local_90 = (ulong)((int)local_90 + 1);
        iVar10 = 0;
      }
LAB_001137b3:
    } while (('\0' < local_70.e) && ((long)puVar9 - (long)puVar11 <= local_78));
    _lws_log(1,"%s: ended on e %d\n","lws_parse_numeric_address");
    iVar10 = -0xe;
  }
  return iVar10;
}

Assistant:

int
lws_parse_numeric_address(const char *ads, uint8_t *result, size_t max_len)
{
	struct lws_tokenize ts;
	uint8_t *orig = result, temp[16];
	int sects = 0, ipv6 = !!strchr(ads, ':'), skip_point = -1, dm = 0;
	char t[5];
	size_t n;
	long u;

	lws_tokenize_init(&ts, ads, LWS_TOKENIZE_F_NO_INTEGERS |
				    LWS_TOKENIZE_F_MINUS_NONTERM);
	ts.len = strlen(ads);
	if (!ipv6 && ts.len < 7)
		return -1;

	if (ipv6 && ts.len < 2)
		return -2;

	if (!ipv6 && max_len < 4)
		return -3;

	if (ipv6 && max_len < 16)
		return -4;

	if (ipv6)
		memset(result, 0, max_len);

	do {
		ts.e = (int8_t)lws_tokenize(&ts);
		switch (ts.e) {
		case LWS_TOKZE_TOKEN:
			dm = 0;
			if (ipv6) {
				if (ts.token_len > 4)
					return -1;
				memcpy(t, ts.token, ts.token_len);
				t[ts.token_len] = '\0';
				for (n = 0; n < ts.token_len; n++)
					if (t[n] < '0' || t[n] > 'f' ||
					    (t[n] > '9' && t[n] < 'A') ||
					    (t[n] > 'F' && t[n] < 'a'))
						return -1;
				u = strtol(t, NULL, 16);
				if (u > 0xffff)
					return -5;
				*result++ = (uint8_t)(u >> 8);
			} else {
				if (ts.token_len > 3)
					return -1;
				memcpy(t, ts.token, ts.token_len);
				t[ts.token_len] = '\0';
				for (n = 0; n < ts.token_len; n++)
					if (t[n] < '0' || t[n] > '9')
						return -1;
				u = strtol(t, NULL, 10);
				if (u > 0xff)
					return -6;
			}
			if (u < 0)
				return -7;
			*result++ = (uint8_t)u;
			sects++;
			break;

		case LWS_TOKZE_DELIMITER:
			if (dm++) {
				if (dm > 2)
					return -8;
				if (*ts.token != ':')
					return -9;
				/* back to back : */
				*result++ = 0;
				*result++ = 0;
				skip_point = lws_ptr_diff(result, orig);
				break;
			}
			if (ipv6 && orig[2] == 0xff && orig[3] == 0xff &&
			    skip_point == 2) {
				/* ipv4 backwards compatible format */
				ipv6 = 0;
				memset(orig, 0, max_len);
				orig[10] = 0xff;
				orig[11] = 0xff;
				skip_point = -1;
				result = &orig[12];
				sects = 0;
				break;
			}
			if (ipv6 && *ts.token != ':')
				return -10;
			if (!ipv6 && *ts.token != '.')
				return -11;
			break;

		case LWS_TOKZE_ENDED:
			if (!ipv6 && sects == 4)
				return lws_ptr_diff(result, orig);
			if (ipv6 && sects == 8)
				return lws_ptr_diff(result, orig);
			if (skip_point != -1) {
				int ow = lws_ptr_diff(result, orig);
				/*
				 * contains ...::...
				 */
				if (ow == 16)
					return 16;
				memcpy(temp, &orig[skip_point], (unsigned int)(ow - skip_point));
				memset(&orig[skip_point], 0, (unsigned int)(16 - skip_point));
				memcpy(&orig[16 - (ow - skip_point)], temp,
						   (unsigned int)(ow - skip_point));

				return 16;
			}
			return -12;

		default: /* includes ENDED */
			lwsl_err("%s: malformed ip address\n",
				 __func__);

			return -13;
		}
	} while (ts.e > 0 && result - orig <= (int)max_len);

	lwsl_err("%s: ended on e %d\n", __func__, ts.e);

	return -14;
}